

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

bool __thiscall
ggml::cpu::aarch64::tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8>::work_size
          (tensor_traits<block_q4_0,_4L,_4L,_(ggml_type)8> *this,int param_1,ggml_tensor *op,
          size_t *size)

{
  undefined8 uVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  
  if (op->op == GGML_OP_MUL_MAT_ID) {
    uVar1 = ggml_nelements(op->src[1],CONCAT44(in_register_00000034,param_1));
    lVar3 = ggml_row_size(8,uVar1);
    uVar4 = lVar3 + 7U & 0xfffffffffffffff8;
    *size = uVar4;
    sVar2 = (op->src[0]->ne[2] * 8 + 8) * op->src[1]->ne[2] + uVar4;
  }
  else {
    if (op->op != GGML_OP_MUL_MAT) {
      return false;
    }
    uVar1 = ggml_nelements(op->src[1],CONCAT44(in_register_00000034,param_1));
    sVar2 = ggml_row_size(8,uVar1);
  }
  *size = sVar2;
  return true;
}

Assistant:

bool work_size(int /* n_threads */, const struct ggml_tensor * op, size_t & size) override {
        // not realy a GGML_TYPE_Q8_0 but same size.
        switch (op->op) {
            case GGML_OP_MUL_MAT:
                size = ggml_row_size(PARAM_TYPE, ggml_nelements(op->src[1]));
                return true;
            case GGML_OP_MUL_MAT_ID:
                size = ggml_row_size(PARAM_TYPE, ggml_nelements(op->src[1]));
                size = GGML_PAD(size, sizeof(int64_t));  // + padding for next bloc.
                size += sizeof(int64_t) * (1+op->src[0]->ne[2]) * op->src[1]->ne[2];
                return true;
            default:
                // GGML_ABORT("fatal error");
                break;
        }
        return false;
    }